

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::NegativeAPIBlockBinding::~NegativeAPIBlockBinding
          (NegativeAPIBlockBinding *this)

{
  NegativeAPIBlockBinding *this_local;
  
  ShaderStorageBufferObjectBase::~ShaderStorageBufferObjectBase
            (&this->super_ShaderStorageBufferObjectBase);
  return;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;
		GLint bindings;
		glGetIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &bindings);

		const char* const glsl_vs =
			"#version 430 core" NL "buffer Buffer {" NL "  int x;" NL "};" NL "void main() {" NL "  x = 0;" NL "}";
		const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
		glShaderSource(sh, 1, &glsl_vs, NULL);
		glCompileShader(sh);

		const GLuint p = glCreateProgram();
		glAttachShader(p, sh);
		glDeleteShader(sh);
		glLinkProgram(p);

		glShaderStorageBlockBinding(p, 0, bindings);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("An INVALID_VALUE error is generated if storageBlockBinding is\n"
				   "greater than or equal to the value of MAX_SHADER_STORAGE_BUFFER_BINDINGS.\n");
			glDeleteProgram(p);
			return ERROR;
		}

		glShaderStorageBlockBinding(p, 1, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("An INVALID_VALUE error is generated if storageBlockIndex is not an\n"
				   "active shader storage block index in program.\n");
			glDeleteProgram(p);
			return ERROR;
		}

		glShaderStorageBlockBinding(0, 0, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("An INVALID_VALUE error is generated if program is not the name of either a program or shader "
				   "object.\n");
			glDeleteProgram(p);
			return ERROR;
		}

		glShaderStorageBlockBinding(sh, 0, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("An INVALID_OPERATION error is generated if program is the name of a shader object.\n");
			glDeleteProgram(p);
			return ERROR;
		}

		glDeleteProgram(p);
		return NO_ERROR;
	}